

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O3

void av1_init_cdef_worker(AV1_COMP *cpi)

{
  AV1_PRIMARY *pAVar1;
  
  pAVar1 = cpi->ppi;
  if ((pAVar1->gf_group).frame_parallel_level[cpi->gf_frame_index] < 1) {
    av1_alloc_cdef_buffers
              (&cpi->common,&(pAVar1->p_mt_info).cdef_worker,&(cpi->mt_info).cdef_sync,
               (pAVar1->p_mt_info).num_mod_workers
               [(ulong)((pAVar1->p_mt_info).num_mod_workers[10] < 2) * 8 + -1],1);
    (cpi->mt_info).cdef_worker = (pAVar1->p_mt_info).cdef_worker;
  }
  return;
}

Assistant:

void av1_init_cdef_worker(AV1_COMP *cpi) {
  // The allocation is done only for level 0 parallel frames. No change
  // in config is supported in the middle of a parallel encode set, since the
  // rest of the MT modules also do not support dynamic change of config.
  if (cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0) return;
  PrimaryMultiThreadInfo *const p_mt_info = &cpi->ppi->p_mt_info;
  int num_cdef_workers = av1_get_num_mod_workers_for_alloc(p_mt_info, MOD_CDEF);

  av1_alloc_cdef_buffers(&cpi->common, &p_mt_info->cdef_worker,
                         &cpi->mt_info.cdef_sync, num_cdef_workers, 1);
  cpi->mt_info.cdef_worker = p_mt_info->cdef_worker;
}